

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

_Bool conf_deserialise(Conf *conf,BinarySource *src)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  conf_entry *entry_00;
  char *pcVar5;
  Filename *pFVar6;
  FontSpec *pFVar7;
  uint primary;
  conf_entry *entry;
  BinarySource *src_local;
  Conf *conf_local;
  
  while( true ) {
    uVar4 = BinarySource_get_uint32(src->binarysource_);
    uVar2 = (uint)uVar4;
    if (src->binarysource_->err != BSE_NO_ERROR) {
      return false;
    }
    if (uVar2 == 0xffffffff) {
      return true;
    }
    if (0xcd < uVar2) {
      return false;
    }
    entry_00 = (conf_entry *)safemalloc(1,0x18,0);
    (entry_00->key).primary = uVar2;
    if (subkeytypes[(entry_00->key).primary] == 2) {
      uVar4 = BinarySource_get_uint32(src->binarysource_);
      iVar3 = toint((uint)uVar4);
      (entry_00->key).secondary.i = iVar3;
    }
    else if (subkeytypes[(entry_00->key).primary] == 3) {
      pcVar5 = BinarySource_get_asciz(src->binarysource_);
      pcVar5 = dupstr(pcVar5);
      (entry_00->key).secondary.s = pcVar5;
    }
    switch(valuetypes[(entry_00->key).primary]) {
    case 1:
      _Var1 = BinarySource_get_bool(src->binarysource_);
      (entry_00->value).u.boolval = _Var1;
      break;
    case 2:
      uVar4 = BinarySource_get_uint32(src->binarysource_);
      iVar3 = toint((uint)uVar4);
      (entry_00->value).u.intval = iVar3;
      break;
    case 3:
      pcVar5 = BinarySource_get_asciz(src->binarysource_);
      pcVar5 = dupstr(pcVar5);
      (entry_00->value).u.stringval = pcVar5;
      break;
    case 4:
      pFVar6 = filename_deserialise(src);
      (entry_00->value).u.fileval = pFVar6;
      break;
    case 5:
      pFVar7 = fontspec_deserialise(src);
      (entry_00->value).u.fontval = pFVar7;
    }
    if (src->binarysource_->err != BSE_NO_ERROR) break;
    conf_insert(conf,entry_00);
  }
  free_entry(entry_00);
  return false;
}

Assistant:

bool conf_deserialise(Conf *conf, BinarySource *src)
{
    struct conf_entry *entry;
    unsigned primary;

    while (1) {
        primary = get_uint32(src);

        if (get_err(src))
            return false;
        if (primary == 0xFFFFFFFFU)
            return true;
        if (primary >= N_CONFIG_OPTIONS)
            return false;

        entry = snew(struct conf_entry);
        entry->key.primary = primary;

        switch (subkeytypes[entry->key.primary]) {
          case TYPE_INT:
            entry->key.secondary.i = toint(get_uint32(src));
            break;
          case TYPE_STR:
            entry->key.secondary.s = dupstr(get_asciz(src));
            break;
        }

        switch (valuetypes[entry->key.primary]) {
          case TYPE_BOOL:
            entry->value.u.boolval = get_bool(src);
            break;
          case TYPE_INT:
            entry->value.u.intval = toint(get_uint32(src));
            break;
          case TYPE_STR:
            entry->value.u.stringval = dupstr(get_asciz(src));
            break;
          case TYPE_FILENAME:
            entry->value.u.fileval = filename_deserialise(src);
            break;
          case TYPE_FONT:
            entry->value.u.fontval = fontspec_deserialise(src);
            break;
        }

        if (get_err(src)) {
            free_entry(entry);
            return false;
        }

        conf_insert(conf, entry);
    }
}